

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<long,_11>::Resize(TPZManVector<long,_11> *this,int64_t newsize,long *object)

{
  long *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *plVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t i;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar3 = _DAT_014d28c0;
  auVar2 = _DAT_014d28b0;
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = (this->super_TPZVec<long>).fNElements;
  if (newsize != lVar7) {
    lVar5 = (this->super_TPZVec<long>).fNAlloc;
    if (lVar5 < newsize) {
      if ((ulong)newsize < 0xc) {
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          plVar4 = (this->super_TPZVec<long>).fStore;
          lVar5 = 0;
          do {
            this->fExtAlloc[lVar5] = plVar4[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar7 != lVar5);
        }
        auVar3 = _DAT_014d28c0;
        auVar2 = _DAT_014d28b0;
        lVar5 = newsize - lVar7;
        if (lVar5 != 0 && lVar7 <= newsize) {
          lVar6 = *object;
          lVar8 = lVar5 + -1;
          auVar12._8_4_ = (int)lVar8;
          auVar12._0_8_ = lVar8;
          auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar10 = 0;
          auVar12 = auVar12 ^ _DAT_014d28c0;
          do {
            auVar16._8_4_ = (int)uVar10;
            auVar16._0_8_ = uVar10;
            auVar16._12_4_ = (int)(uVar10 >> 0x20);
            auVar17 = (auVar16 | auVar2) ^ auVar3;
            if ((bool)(~(auVar17._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar17._0_4_ ||
                        auVar12._4_4_ < auVar17._4_4_) & 1)) {
              this->fExtAlloc[lVar7 + uVar10] = lVar6;
            }
            if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
                auVar17._12_4_ <= auVar12._12_4_) {
              this->fExtAlloc[lVar7 + uVar10 + 1] = lVar6;
            }
            uVar10 = uVar10 + 2;
          } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar10);
        }
        plVar4 = (this->super_TPZVec<long>).fStore;
        if (plVar4 != (long *)0x0 && plVar4 != this->fExtAlloc) {
          operator_delete__(plVar4);
        }
        (this->super_TPZVec<long>).fStore = this->fExtAlloc;
        (this->super_TPZVec<long>).fNElements = newsize;
        (this->super_TPZVec<long>).fNAlloc = 0xb;
      }
      else {
        dVar13 = (double)lVar5 * 1.2;
        uVar10 = (long)dVar13;
        if (dVar13 < (double)newsize) {
          uVar10 = newsize;
        }
        plVar4 = (long *)operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
        lVar5 = 0;
        if (0 < lVar7) {
          plVar1 = (this->super_TPZVec<long>).fStore;
          lVar6 = 0;
          do {
            plVar4[lVar6] = plVar1[lVar6];
            lVar6 = lVar6 + 1;
            lVar5 = lVar7;
          } while (lVar7 != lVar6);
        }
        auVar3 = _DAT_014d28c0;
        auVar2 = _DAT_014d28b0;
        lVar7 = newsize - lVar5;
        if (lVar7 != 0 && lVar5 <= newsize) {
          lVar6 = *object;
          lVar8 = lVar7 + -1;
          auVar11._8_4_ = (int)lVar8;
          auVar11._0_8_ = lVar8;
          auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar9 = 0;
          auVar11 = auVar11 ^ _DAT_014d28c0;
          do {
            auVar15._8_4_ = (int)uVar9;
            auVar15._0_8_ = uVar9;
            auVar15._12_4_ = (int)(uVar9 >> 0x20);
            auVar17 = (auVar15 | auVar2) ^ auVar3;
            if ((bool)(~(auVar17._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar17._0_4_ ||
                        auVar11._4_4_ < auVar17._4_4_) & 1)) {
              plVar4[lVar5 + uVar9] = lVar6;
            }
            if ((auVar17._12_4_ != auVar11._12_4_ || auVar17._8_4_ <= auVar11._8_4_) &&
                auVar17._12_4_ <= auVar11._12_4_) {
              plVar4[lVar5 + uVar9 + 1] = lVar6;
            }
            uVar9 = uVar9 + 2;
          } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar9);
        }
        plVar1 = (this->super_TPZVec<long>).fStore;
        if (plVar1 != (long *)0x0 && plVar1 != this->fExtAlloc) {
          operator_delete__(plVar1);
        }
        (this->super_TPZVec<long>).fStore = plVar4;
        (this->super_TPZVec<long>).fNElements = newsize;
        (this->super_TPZVec<long>).fNAlloc = uVar10;
      }
    }
    else {
      lVar5 = newsize - lVar7;
      if (lVar5 != 0 && lVar7 <= newsize) {
        plVar4 = (this->super_TPZVec<long>).fStore;
        lVar6 = *object;
        lVar8 = lVar5 + -1;
        auVar17._8_4_ = (int)lVar8;
        auVar17._0_8_ = lVar8;
        auVar17._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar10 = 0;
        auVar17 = auVar17 ^ _DAT_014d28c0;
        do {
          auVar14._8_4_ = (int)uVar10;
          auVar14._0_8_ = uVar10;
          auVar14._12_4_ = (int)(uVar10 >> 0x20);
          auVar14 = (auVar14 | auVar2) ^ auVar3;
          if ((bool)(~(auVar14._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar14._0_4_ ||
                      auVar17._4_4_ < auVar14._4_4_) & 1)) {
            plVar4[lVar7 + uVar10] = lVar6;
          }
          if ((auVar14._12_4_ != auVar17._12_4_ || auVar14._8_4_ <= auVar17._8_4_) &&
              auVar14._12_4_ <= auVar17._12_4_) {
            plVar4[lVar7 + uVar10 + 1] = lVar6;
          }
          uVar10 = uVar10 + 2;
        } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar10);
      }
      (this->super_TPZVec<long>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}